

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib576.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  chunk_data_t chunk_data;
  undefined8 local_20;
  
  local_20 = 0;
  curl_global_init(3);
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    iVar1 = 0x1b;
  }
  else {
    iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar2,0xc5,1);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar2,0x4ee6,chunk_bgn);
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar2,0x4ee7,chunk_end);
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar2,0x27d9,&local_20);
            if (iVar1 == 0) {
              iVar1 = curl_easy_perform(lVar2);
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar2);
  }
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLcode res = CURLE_OK;
  chunk_data_t chunk_data = {0, 0};
  curl_global_init(CURL_GLOBAL_ALL);
  handle = curl_easy_init();
  if(!handle) {
    res = CURLE_OUT_OF_MEMORY;
    goto test_cleanup;
  }

  test_setopt(handle, CURLOPT_URL, URL);
  test_setopt(handle, CURLOPT_WILDCARDMATCH, 1L);
  test_setopt(handle, CURLOPT_CHUNK_BGN_FUNCTION, chunk_bgn);
  test_setopt(handle, CURLOPT_CHUNK_END_FUNCTION, chunk_end);
  test_setopt(handle, CURLOPT_CHUNK_DATA, &chunk_data);

  res = curl_easy_perform(handle);

test_cleanup:
  if(handle)
    curl_easy_cleanup(handle);
  curl_global_cleanup();
  return res;
}